

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

VkBlendFactor __thiscall
Diligent::BlendFactorToVkBlendFactorMapper::operator[]
          (BlendFactorToVkBlendFactorMapper *this,BLEND_FACTOR bf)

{
  char (*in_RCX) [61];
  string msg;
  string local_38;
  
  if (0x10 < (byte)(bf - BLEND_FACTOR_ZERO)) {
    FormatString<char[26],char[61]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"bf > BLEND_FACTOR_UNDEFINED && bf < BLEND_FACTOR_NUM_FACTORS",in_RCX)
    ;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x359);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return (this->m_Map)._M_elems[(char)bf];
}

Assistant:

VkBlendFactor operator[](BLEND_FACTOR bf) const
    {
        VERIFY_EXPR(bf > BLEND_FACTOR_UNDEFINED && bf < BLEND_FACTOR_NUM_FACTORS);
        return m_Map[static_cast<int>(bf)];
    }